

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerator.cxx
# Opt level: O3

void __thiscall cmQtAutoGenerator::Logger::Info(Logger *this,GenT genType,string *message)

{
  pointer pcVar1;
  int iVar2;
  string *psVar3;
  string msg;
  string local_40;
  
  psVar3 = cmQtAutoGen::GeneratorName_abi_cxx11_(genType);
  pcVar1 = (psVar3->_M_dataplus)._M_p;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + psVar3->_M_string_length);
  std::__cxx11::string::append((char *)&local_40);
  std::__cxx11::string::_M_append((char *)&local_40,(ulong)(message->_M_dataplus)._M_p);
  if (local_40._M_dataplus._M_p[local_40._M_string_length - 1] != '\n') {
    std::__cxx11::string::push_back((char)&local_40);
  }
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar2 == 0) {
    cmSystemTools::Stdout(&local_40);
    pthread_mutex_unlock((pthread_mutex_t *)this);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

void cmQtAutoGenerator::Logger::Info(GenT genType,
                                     std::string const& message) const
{
  std::string msg = GeneratorName(genType);
  msg += ": ";
  msg += message;
  if (msg.back() != '\n') {
    msg.push_back('\n');
  }
  {
    std::lock_guard<std::mutex> lock(Mutex_);
    cmSystemTools::Stdout(msg);
  }
}